

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int parse_json(char *s,int s_len,json_token *arr,int arr_len)

{
  undefined1 auStack_58 [4];
  int _n;
  frozen frozen;
  int arr_len_local;
  json_token *arr_local;
  int s_len_local;
  char *s_local;
  
  frozen._36_4_ = arr_len;
  memset(auStack_58,0,0x28);
  _auStack_58 = s + s_len;
  frozen.tokens._0_4_ = frozen._36_4_;
  frozen.end = s;
  frozen.cur = (char *)arr;
  s_local._4_4_ = doit((frozen *)auStack_58);
  if (-1 < s_local._4_4_) {
    s_local._4_4_ = (int)frozen.end - (int)s;
  }
  return s_local._4_4_;
}

Assistant:

int parse_json(const char *s, int s_len, struct json_token *arr, int arr_len) {
    struct frozen frozen;

    memset(&frozen, 0, sizeof(frozen));
    frozen.end = s + s_len;
    frozen.cur = s;
    frozen.tokens = arr;
    frozen.max_tokens = arr_len;

    TRY(doit(&frozen));

    return frozen.cur - s;
}